

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall
tchecker::clockbounds::df_solver_t::df_solver_t(df_solver_t *this,df_solver_t *solver)

{
  pointer puVar1;
  
  this->_loc_number = solver->_loc_number;
  this->_clock_number = solver->_clock_number;
  puVar1 = (solver->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (solver->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (solver->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (solver->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (solver->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (solver->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_dim = solver->_dim;
  this->_L = solver->_L;
  this->_U = solver->_U;
  this->_updated_L = solver->_updated_L;
  this->_updated_U = solver->_updated_U;
  solver->_loc_number = 0;
  solver->_clock_number = 0;
  solver->_dim = 1;
  solver->_L = (db_t *)0x0;
  solver->_U = (db_t *)0x0;
  solver->_updated_L = false;
  solver->_updated_U = false;
  return;
}

Assistant:

df_solver_t::df_solver_t(tchecker::clockbounds::df_solver_t && solver)
    : _loc_number(std::move(solver._loc_number)), _clock_number(std::move(solver._clock_number)),
      _loc_pid(std::move(solver._loc_pid)), _dim(std::move(solver._dim)), _L(std::move(solver._L)), _U(std::move(solver._U)),
      _updated_L(std::move(solver._updated_L)), _updated_U(std::move(solver._updated_U))
{
  solver._loc_number = 0;
  solver._clock_number = 0;
  solver._dim = 1;
  solver._L = nullptr;
  solver._U = nullptr;
  solver._updated_L = false;
  solver._updated_U = false;
}